

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O2

CURLcode glob_match_url(char **result,char *filename,URLGlob *glob)

{
  size_t *psVar1;
  int iVar2;
  char *__ptr;
  ulong uVar3;
  char *pcVar4;
  size_t __n;
  long lVar5;
  size_t *psVar6;
  ulong uVar7;
  char *__s;
  char *local_70;
  size_t local_68;
  char **local_60;
  size_t *local_58;
  URLGlob *local_50;
  char numbuf [18];
  
  *result = (char *)0x0;
  local_70 = filename;
  local_68 = strlen(filename);
  local_68 = local_68 + 1;
  __ptr = (char *)malloc(local_68);
  if (__ptr == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  local_58 = &glob[-1].size;
  __s = "";
  __n = 0;
  uVar7 = 0;
  local_60 = result;
  local_50 = glob;
  do {
    if (*filename == '#') {
      iVar2 = Curl_isdigit((uint)(byte)filename[1]);
      if (((iVar2 == 0) || (uVar3 = strtoul(filename + 1,&local_70,10), uVar3 == 0)) ||
         (local_50->size <= uVar3)) goto LAB_0011c96f;
      lVar5 = local_50->size + 1;
      psVar1 = local_58;
      do {
        psVar6 = psVar1;
        lVar5 = lVar5 + -1;
        if (lVar5 == 0) goto LAB_0011c96f;
        psVar1 = psVar6 + 6;
      } while (*(int *)((long)psVar6 + 0x34) != (int)uVar3 + -1);
      iVar2 = (int)psVar6[6];
      if (iVar2 != 3) {
        if (iVar2 != 2) {
          if (iVar2 != 1) {
            curl_mfprintf(_stderr,"internal error: invalid pattern type (%d)\n");
            free(__ptr);
            return CURLE_FAILED_INIT;
          }
          if (psVar6[7] != 0) {
            __s = *(char **)(psVar6[7] + (long)*(int *)((long)psVar6 + 0x44) * 8);
            goto LAB_0011c9f2;
          }
          goto LAB_0011c975;
        }
        numbuf[0] = *(char *)((long)psVar6 + 0x3a);
        numbuf[1] = '\0';
        filename = numbuf;
        goto LAB_0011c972;
      }
      __s = numbuf;
      curl_msnprintf(__s,0x12,"%0*lu",*(int *)(psVar6 + 9),psVar6[10]);
LAB_0011c9f2:
      __n = strlen(__s);
    }
    else {
      if (*filename == '\0') {
        __ptr[uVar7] = '\0';
        *local_60 = __ptr;
        return CURLE_OK;
      }
LAB_0011c96f:
      local_70 = filename + 1;
LAB_0011c972:
      __n = 1;
      __s = filename;
    }
LAB_0011c975:
    uVar3 = __n + uVar7;
    pcVar4 = __ptr;
    if (local_68 <= uVar3) {
      pcVar4 = (char *)realloc(__ptr,uVar3 * 2 + 1);
      if (pcVar4 == (char *)0x0) {
        free(__ptr);
        return CURLE_OUT_OF_MEMORY;
      }
      local_68 = uVar3 * 2;
    }
    memcpy(pcVar4 + uVar7,__s,__n);
    uVar7 = uVar3;
    filename = local_70;
    __ptr = pcVar4;
  } while( true );
}

Assistant:

CURLcode glob_match_url(char **result, char *filename, URLGlob *glob)
{
  char *target;
  size_t allocsize;
  char numbuf[18];
  char *appendthis = (char *)"";
  size_t appendlen = 0;
  size_t stringlen = 0;

  *result = NULL;

  /* We cannot use the glob_buffer for storage here since the filename may
   * be longer than the URL we use. We allocate a good start size, then
   * we need to realloc in case of need.
   */
  allocsize = strlen(filename) + 1; /* make it at least one byte to store the
                                       trailing zero */
  target = malloc(allocsize);
  if(!target)
    return CURLE_OUT_OF_MEMORY;

  while(*filename) {
    if(*filename == '#' && ISDIGIT(filename[1])) {
      char *ptr = filename;
      unsigned long num = strtoul(&filename[1], &filename, 10);
      URLPattern *pat = NULL;

      if(num && (num < glob->size)) {
        unsigned long i;
        num--; /* make it zero based */
        /* find the correct glob entry */
        for(i = 0; i<glob->size; i++) {
          if(glob->pattern[i].globindex == (int)num) {
            pat = &glob->pattern[i];
            break;
          }
        }
      }

      if(pat) {
        switch(pat->type) {
        case UPTSet:
          if(pat->content.Set.elements) {
            appendthis = pat->content.Set.elements[pat->content.Set.ptr_s];
            appendlen =
              strlen(pat->content.Set.elements[pat->content.Set.ptr_s]);
          }
          break;
        case UPTCharRange:
          numbuf[0] = pat->content.CharRange.ptr_c;
          numbuf[1] = 0;
          appendthis = numbuf;
          appendlen = 1;
          break;
        case UPTNumRange:
          msnprintf(numbuf, sizeof(numbuf), "%0*lu",
                    pat->content.NumRange.padlength,
                    pat->content.NumRange.ptr_n);
          appendthis = numbuf;
          appendlen = strlen(numbuf);
          break;
        default:
          fprintf(stderr, "internal error: invalid pattern type (%d)\n",
                  (int)pat->type);
          Curl_safefree(target);
          return CURLE_FAILED_INIT;
        }
      }
      else {
        /* #[num] out of range, use the #[num] in the output */
        filename = ptr;
        appendthis = filename++;
        appendlen = 1;
      }
    }
    else {
      appendthis = filename++;
      appendlen = 1;
    }
    if(appendlen + stringlen >= allocsize) {
      char *newstr;
      /* we append a single byte to allow for the trailing byte to be appended
         at the end of this function outside the while() loop */
      allocsize = (appendlen + stringlen) * 2;
      newstr = realloc(target, allocsize + 1);
      if(!newstr) {
        Curl_safefree(target);
        return CURLE_OUT_OF_MEMORY;
      }
      target = newstr;
    }
    memcpy(&target[stringlen], appendthis, appendlen);
    stringlen += appendlen;
  }
  target[stringlen]= '\0';

#if defined(MSDOS) || defined(WIN32)
  {
    char *sanitized;
    SANITIZEcode sc = sanitize_file_name(&sanitized, target,
                                         (SANITIZE_ALLOW_PATH |
                                          SANITIZE_ALLOW_RESERVED));
    Curl_safefree(target);
    if(sc)
      return CURLE_URL_MALFORMAT;
    target = sanitized;
  }
#endif /* MSDOS || WIN32 */

  *result = target;
  return CURLE_OK;
}